

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O1

void radio_float(t_radio *x,t_floatarg f)

{
  t_pd *pp_Var1;
  int iVar2;
  int iVar3;
  t_atom at [2];
  t_atom local_38;
  undefined4 local_28;
  undefined4 local_20;
  
  iVar2 = 0;
  if (0 < (int)f) {
    iVar2 = (int)f;
  }
  x->x_fval = f;
  iVar3 = x->x_number + -1;
  if (iVar2 < x->x_number) {
    iVar3 = iVar2;
  }
  if (x->x_compat == 0) {
    if (pd_compatibilitylevel < 0x2e) {
      f = (t_floatarg)iVar3;
    }
    x->x_on_old = x->x_on;
    x->x_on = iVar3;
    (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
    if (((x->x_gui).x_fsf.field_0x3 & 4) != 0) {
      outlet_float((x->x_gui).x_obj.te_outlet,f);
      if ((((uint)(x->x_gui).x_fsf & 0x80) != 0) &&
         (pp_Var1 = ((x->x_gui).x_snd)->s_thing, pp_Var1 != (t_pd *)0x0)) {
        pd_float(pp_Var1,f);
        return;
      }
    }
  }
  else {
    if (((x->x_change != 0) && (iVar3 != x->x_on_old)) && (((x->x_gui).x_fsf.field_0x3 & 4) != 0)) {
      local_38.a_type = A_FLOAT;
      local_38.a_w.w_float = (t_float)x->x_on_old;
      local_28 = 1;
      local_20 = 0;
      outlet_list((x->x_gui).x_obj.te_outlet,&s_list,2,&local_38);
      if ((((uint)(x->x_gui).x_fsf & 0x80) != 0) &&
         (pp_Var1 = ((x->x_gui).x_snd)->s_thing, pp_Var1 != (t_pd *)0x0)) {
        pd_list(pp_Var1,&s_list,2,&local_38);
      }
    }
    if (x->x_on != x->x_on_old) {
      x->x_on_old = x->x_on;
    }
    x->x_on = iVar3;
    (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
    x->x_on_old = x->x_on;
    if (((x->x_gui).x_fsf.field_0x3 & 4) != 0) {
      local_38.a_type = A_FLOAT;
      local_38.a_w.w_float = (t_float)x->x_on;
      local_28 = 1;
      local_20 = 0x3f800000;
      outlet_list((x->x_gui).x_obj.te_outlet,&s_list,2,&local_38);
      if ((((uint)(x->x_gui).x_fsf & 0x80) != 0) &&
         (pp_Var1 = ((x->x_gui).x_snd)->s_thing, pp_Var1 != (t_pd *)0x0)) {
        pd_list(pp_Var1,&s_list,2,&local_38);
      }
    }
  }
  return;
}

Assistant:

static void radio_float(t_radio *x, t_floatarg f)
{
    int i = (int)f;
    x->x_fval = f;
    if(i < 0)
        i = 0;
    if(i >= x->x_number)
        i = x->x_number - 1;

    if(x->x_compat)
    {
        t_atom at[2];
            /* compatibility with earlier "[hv]dial" behavior */
        if((x->x_change) && (i != x->x_on_old))
        {
            if(x->x_gui.x_fsf.x_put_in2out)
            {
                SETFLOAT(at+0, (t_float)x->x_on_old);
                SETFLOAT(at+1, 0.0);
                outlet_list(x->x_gui.x_obj.ob_outlet, &s_list, 2, at);
                if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
                    pd_list(x->x_gui.x_snd->s_thing, &s_list, 2, at);
            }
        }
        if(x->x_on != x->x_on_old)
            x->x_on_old = x->x_on;
        x->x_on = i;
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
        x->x_on_old = x->x_on;
        if(x->x_gui.x_fsf.x_put_in2out)
        {
            SETFLOAT(at+0, (t_float)x->x_on);
            SETFLOAT(at+1, 1.0);
            outlet_list(x->x_gui.x_obj.ob_outlet, &s_list, 2, at);
            if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
                pd_list(x->x_gui.x_snd->s_thing, &s_list, 2, at);
        }
    }
    else
    {
        t_float outval = (pd_compatibilitylevel < 46 ? i : x->x_fval);
        x->x_on_old = x->x_on;
        x->x_on = i;
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
        if(x->x_gui.x_fsf.x_put_in2out)
        {
            outlet_float(x->x_gui.x_obj.ob_outlet, outval);
            if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
                pd_float(x->x_gui.x_snd->s_thing, outval);
        }
    }
}